

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplatedCustomNamer.cpp
# Opt level: O0

Path * __thiscall
ApprovalTests::TemplatedCustomNamer::constructFromTemplate
          (TemplatedCustomNamer *this,string *extensionWithDot,string *approvedOrReceivedReplacement
          )

{
  char *pcVar1;
  undefined8 in_RDX;
  long in_RSI;
  Path *in_RDI;
  char *fileExtension;
  char *approvedOrReceived;
  char *testCaseName;
  char *testFileName;
  char *approvalsSubdirectory;
  char *relativeTestSourceDirectory;
  char *testSourceDirectory;
  string result;
  anon_class_8_1_2ea8c437 *in_stack_fffffffffffffa58;
  string *psVar2;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_fffffffffffffa60;
  Path *this_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_fffffffffffffab8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *replacer;
  string *in_stack_fffffffffffffac0;
  string *pattern;
  string *in_stack_fffffffffffffac8;
  undefined1 local_470 [40];
  string local_448 [32];
  string local_428 [32];
  string local_408 [79];
  allocator local_3b9;
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [79];
  undefined1 local_329 [33];
  string local_308 [32];
  string local_2e8 [79];
  allocator local_299;
  string local_298 [32];
  string local_278 [32];
  string local_258 [2];
  allocator local_209;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [79];
  allocator local_179;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  undefined8 local_118;
  allocator local_e9;
  string local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  char *local_78;
  char *local_70;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  string local_40;
  undefined8 local_18;
  
  local_18 = in_RDX;
  ::std::__cxx11::string::string((string *)&local_40,(string *)(in_RSI + 0x10));
  local_48 = "{TestSourceDirectory}";
  local_50 = "{RelativeTestSourceDirectory}";
  local_58 = "{ApprovalsSubdirectory}";
  local_60 = "{TestFileName}";
  local_68 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)0x24c68d;
  local_70 = "{ApprovedOrReceived}";
  local_78 = "{FileExtension}";
  ::std::__cxx11::string::string(local_b8,(string *)&local_40);
  pcVar1 = local_78;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
  local_118 = local_18;
  ::std::function<std::__cxx11::string()>::
  function<ApprovalTests::TemplatedCustomNamer::constructFromTemplate(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0,void>
            (in_stack_fffffffffffffa60,(anon_class_8_1_b88fbbe2 *)in_stack_fffffffffffffa58);
  anon_unknown.dwarf_2acd2d::replaceIfContains
            (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  ::std::__cxx11::string::operator=((string *)&local_40,local_98);
  ::std::__cxx11::string::~string(local_98);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x20717a);
  ::std::__cxx11::string::~string(local_e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  ::std::__cxx11::string::~string(local_b8);
  ::std::__cxx11::string::string(local_158,(string *)&local_40);
  pcVar1 = local_58;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_178,pcVar1,&local_179);
  ::std::function<std::__cxx11::string()>::
  function<ApprovalTests::TemplatedCustomNamer::constructFromTemplate(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__1,void>
            (in_stack_fffffffffffffa60,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa58);
  anon_unknown.dwarf_2acd2d::replaceIfContains
            (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  ::std::__cxx11::string::operator=((string *)&local_40,local_138);
  ::std::__cxx11::string::~string(local_138);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x20728f);
  ::std::__cxx11::string::~string(local_178);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_179);
  ::std::__cxx11::string::~string(local_158);
  ::std::__cxx11::string::string(local_1e8,(string *)&local_40);
  pcVar1 = local_50;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_208,pcVar1,&local_209);
  ::std::function<std::__cxx11::string()>::
  function<ApprovalTests::TemplatedCustomNamer::constructFromTemplate(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__2,void>
            (in_stack_fffffffffffffa60,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa58);
  anon_unknown.dwarf_2acd2d::replaceIfContains
            (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  ::std::__cxx11::string::operator=((string *)&local_40,local_1c8);
  ::std::__cxx11::string::~string(local_1c8);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x2073a4);
  ::std::__cxx11::string::~string(local_208);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
  ::std::__cxx11::string::~string(local_1e8);
  ::std::__cxx11::string::string(local_278,(string *)&local_40);
  pcVar1 = local_60;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_298,pcVar1,&local_299);
  ::std::function<std::__cxx11::string()>::
  function<ApprovalTests::TemplatedCustomNamer::constructFromTemplate(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__3,void>
            (in_stack_fffffffffffffa60,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa58);
  anon_unknown.dwarf_2acd2d::replaceIfContains
            (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  psVar2 = local_258;
  ::std::__cxx11::string::operator=((string *)&local_40,(string *)psVar2);
  ::std::__cxx11::string::~string((string *)psVar2);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x2074b9);
  ::std::__cxx11::string::~string(local_298);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_299);
  ::std::__cxx11::string::~string(local_278);
  ::std::__cxx11::string::string(local_308,(string *)&local_40);
  pattern = (string *)local_329;
  replacer = local_68;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)(local_329 + 1),(char *)replacer,(allocator *)pattern);
  ::std::function<std::__cxx11::string()>::
  function<ApprovalTests::TemplatedCustomNamer::constructFromTemplate(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__4,void>
            (in_stack_fffffffffffffa60,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa58);
  anon_unknown.dwarf_2acd2d::replaceIfContains(psVar2,pattern,replacer);
  ::std::__cxx11::string::operator=((string *)&local_40,local_2e8);
  ::std::__cxx11::string::~string(local_2e8);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x2075b3);
  ::std::__cxx11::string::~string((string *)(local_329 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_329);
  ::std::__cxx11::string::~string(local_308);
  ::std::__cxx11::string::string(local_398,(string *)&local_40);
  pcVar1 = local_48;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_3b8,pcVar1,&local_3b9);
  ::std::function<std::__cxx11::string()>::
  function<ApprovalTests::TemplatedCustomNamer::constructFromTemplate(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__5,void>
            (in_stack_fffffffffffffa60,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffa58);
  anon_unknown.dwarf_2acd2d::replaceIfContains(psVar2,pattern,replacer);
  ::std::__cxx11::string::operator=((string *)&local_40,local_378);
  ::std::__cxx11::string::~string(local_378);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x2076aa);
  ::std::__cxx11::string::~string(local_3b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  ::std::__cxx11::string::~string(local_398);
  ::std::__cxx11::string::string(local_428,(string *)&local_40);
  pcVar1 = local_70;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_448,pcVar1,(allocator *)(local_470 + 0x27));
  this_00 = (Path *)local_470;
  ::std::function<std::__cxx11::string()>::
  function<ApprovalTests::TemplatedCustomNamer::constructFromTemplate(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__6,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)this_00,in_stack_fffffffffffffa58);
  anon_unknown.dwarf_2acd2d::replaceIfContains(psVar2,pattern,replacer);
  psVar2 = &local_40;
  ::std::__cxx11::string::operator=((string *)psVar2,local_408);
  ::std::__cxx11::string::~string(local_408);
  ::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x2077a1);
  ::std::__cxx11::string::~string(local_448);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_470 + 0x27));
  ::std::__cxx11::string::~string(local_428);
  Path::Path(this_00,psVar2);
  ::std::__cxx11::string::~string((string *)&local_40);
  return in_RDI;
}

Assistant:

Path TemplatedCustomNamer::constructFromTemplate(
        const std::string& extensionWithDot,
        const std::string& approvedOrReceivedReplacement) const
    {
        std::string result = template_;
        // begin-snippet: custom_namer_tags
        auto testSourceDirectory = "{TestSourceDirectory}";
        auto relativeTestSourceDirectory = "{RelativeTestSourceDirectory}";
        auto approvalsSubdirectory = "{ApprovalsSubdirectory}";
        auto testFileName = "{TestFileName}";
        auto testCaseName = "{TestCaseName}";
        auto approvedOrReceived = "{ApprovedOrReceived}";
        auto fileExtension = "{FileExtension}";
        // end-snippet

        using namespace ApprovalTests;

        // clang-format off
        result = replaceIfContains(result, fileExtension, [&](){return extensionWithDot.substr(1);});
        result = replaceIfContains(result, approvalsSubdirectory, [&](){return namer_.getApprovalsSubdirectory();});
        result = replaceIfContains(result, relativeTestSourceDirectory, [&](){return namer_.getRelativeTestSourceDirectory();});
        result = replaceIfContains(result, testFileName, [&](){return namer_.getSourceFileName();});
        result = replaceIfContains(result, testCaseName, [&](){return namer_.getTestName();});
        result = replaceIfContains(result, testSourceDirectory, [&](){return namer_.getTestSourceDirectory();});
        result = replaceIfContains(result, approvedOrReceived, [&](){return approvedOrReceivedReplacement;});
        // clang-format on

        // Convert to native directory separators:
        return Path(result);
    }